

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::enumNBestAsStringInternal
          (LatticeImpl *this,size_t N,StringBuffer *os)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  size_t in_RCX;
  StringBuffer *in_RDX;
  ulong in_RSI;
  StringBuffer *in_RDI;
  Node eon_node;
  size_t i;
  StringBuffer *in_stack_ffffffffffffff58;
  char n;
  undefined1 local_98 [8];
  undefined8 local_90;
  StringBuffer *in_stack_ffffffffffffff90;
  Lattice *in_stack_ffffffffffffffa0;
  Writer *in_stack_ffffffffffffffa8;
  ulong local_28;
  char *local_8;
  long lVar5;
  
  StringBuffer::clear(in_RDX);
  if ((in_RSI == 0) || (0x200 < in_RSI)) {
    (*in_RDI->_vptr_StringBuffer[0x25])(in_RDI,"nbest size must be 1 <= nbest <= 512");
    local_8 = (char *)0x0;
  }
  else {
    local_28 = 0;
    while ((local_28 < in_RSI && (uVar2 = (*in_RDI->_vptr_StringBuffer[0x10])(), (uVar2 & 1) != 0)))
    {
      if (in_RDI[4].alloc_size_ == 0) {
        anon_unknown_3::writeLattice((Lattice *)in_RDI,in_stack_ffffffffffffff58);
      }
      else {
        uVar4 = Writer::write((Writer *)in_RDI[4].alloc_size_,(int)in_RDI,in_RDX,in_RCX);
        if ((uVar4 & 1) == 0) {
          return (char *)0x0;
        }
      }
      local_28 = local_28 + 1;
    }
    n = (char)((ulong)in_stack_ffffffffffffff58 >> 0x38);
    if (in_RDI[4].alloc_size_ != 0) {
      memset(local_98,0,0x70);
      local_90 = 0;
      iVar3 = (*in_RDI->_vptr_StringBuffer[8])();
      lVar5 = CONCAT44(extraout_var,iVar3);
      iVar3 = (*in_RDI->_vptr_StringBuffer[0xb])();
      bVar1 = Writer::writeNode(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                (Node *)(lVar5 + CONCAT44(extraout_var_00,iVar3)),
                                in_stack_ffffffffffffff90);
      n = (char)((ulong)lVar5 >> 0x38);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    StringBuffer::operator<<(in_RDI,n);
    pcVar6 = StringBuffer::str(in_RDX);
    if (pcVar6 == (char *)0x0) {
      (*in_RDI->_vptr_StringBuffer[0x25])(in_RDI,"output buffer overflow");
      local_8 = (char *)0x0;
    }
    else {
      local_8 = StringBuffer::str(in_RDX);
    }
  }
  return local_8;
}

Assistant:

const char *LatticeImpl::enumNBestAsStringInternal(size_t N,
                                                   StringBuffer *os) {
  os->clear();

  if (N == 0 || N > NBEST_MAX) {
    set_what("nbest size must be 1 <= nbest <= 512");
    return 0;
  }

  for (size_t i = 0; i < N; ++i) {
    if (!next()) {
      break;
    }
    if (writer_) {
      if (!writer_->write(this, os)) {
        return 0;
      }
    } else {
      writeLattice(this, os);
    }
  }

  // make a dummy node for EON
  if (writer_) {
    Node eon_node;
    memset(&eon_node, 0, sizeof(eon_node));
    eon_node.stat = MECAB_EON_NODE;
    eon_node.next = 0;
    eon_node.surface = this->sentence() + this->size();
    if (!writer_->writeNode(this, &eon_node, os)) {
      return 0;
    }
  }
  *os << '\0';

  if (!os->str()) {
    set_what("output buffer overflow");
    return 0;
  }

  return os->str();
}